

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int qtree_decode(uchar *infile,int *a,int n,int nqx,int nqy,int nbitplanes)

{
  int iVar1;
  uchar *a_00;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  uchar *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar2;
  double dVar3;
  uchar *scratch;
  int nqy2;
  int nqx2;
  int c;
  int nfy;
  int nfx;
  int ny;
  int nx;
  int nqmax;
  int b;
  int bit;
  int k;
  int log2n;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  int in_stack_ffffffffffffffb0;
  int local_4c;
  int local_48;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  iVar1 = in_R8D;
  if (in_R8D < in_ECX) {
    iVar1 = in_ECX;
  }
  iVar4 = iVar1;
  dVar2 = log((double)iVar1);
  dVar3 = log(2.0);
  local_2c = (int)(dVar2 / dVar3 + 0.5);
  if (1 << ((byte)local_2c & 0x1f) < iVar1) {
    local_2c = local_2c + 1;
  }
  a_00 = (uchar *)malloc((long)((in_ECX + 1) / 2) * (long)((in_R8D + 1) / 2));
  if (a_00 == (uchar *)0x0) {
    ffpmsg((char *)0x26a359);
    local_4 = 0x19e;
  }
  else {
    for (local_34 = in_R9D + -1; -1 < local_34; local_34 = local_34 + -1) {
      iVar1 = input_nybble(in_RDI);
      if (iVar1 == 0) {
        in_stack_ffffffffffffff88 = local_34;
        read_bdirect(a_00,(int *)CONCAT44(iVar4,in_stack_ffffffffffffff98),
                     (int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0),in_stack_ffffffffffffff8c,
                     (uchar *)0x26a3b9,in_stack_ffffffffffffffb0);
      }
      else {
        if (iVar1 != 0xf) {
          ffpmsg((char *)0x26a3d1);
          return 0x19e;
        }
        iVar1 = input_huffman((uchar *)CONCAT44(iVar4,in_stack_ffffffffffffff98));
        *a_00 = (uchar)iVar1;
        in_stack_ffffffffffffffb0 = 1 << ((byte)local_2c & 0x1f);
        local_4c = in_R8D;
        local_48 = in_ECX;
        for (local_30 = 1; local_30 < local_2c; local_30 = local_30 + 1) {
          in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 >> 1;
          if (in_stack_ffffffffffffffb0 < local_48) {
            local_48 = local_48 - in_stack_ffffffffffffffb0;
          }
          if (in_stack_ffffffffffffffb0 < local_4c) {
            local_4c = local_4c - in_stack_ffffffffffffffb0;
          }
          qtree_expand(a_00,(uchar *)CONCAT44(iVar4,in_stack_ffffffffffffff98),
                       (int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0),
                       (uchar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        }
        qtree_bitins(a_00,in_ECX,in_R8D,in_RSI,in_EDX,local_34);
      }
    }
    free(a_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
qtree_decode(unsigned char *infile, int a[], int n, int nqx, int nqy, int nbitplanes)

/*
char *infile;
int a[];				 a is 2-D array with dimensions (n,n)	
int n;					 length of full row in a				
int nqx;				 partial length of row to decode		
int nqy;				 partial length of column (<=n)		
int nbitplanes;				 number of bitplanes to decode		
*/
{
int log2n, k, bit, b, nqmax;
int nx,ny,nfx,nfy,c;
int nqx2, nqy2;
unsigned char *scratch;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * allocate scratch array for working space
	 */
	nqx2=(nqx+1)/2;
	nqy2=(nqy+1)/2;
	scratch = (unsigned char *) malloc((size_t)nqx2*nqy2);
	if (scratch == (unsigned char *) NULL) {
		ffpmsg("qtree_decode: insufficient memory");
		return(DATA_DECOMPRESSION_ERR);
	}
	/*
	 * now decode each bit plane, starting at the top
	 * A is assumed to be initialized to zero
	 */
	for (bit = nbitplanes-1; bit >= 0; bit--) {
		/*
		 * Was bitplane was quadtree-coded or written directly?
		 */
		b = input_nybble(infile);

		if(b == 0) {
			/*
			 * bit map was written directly
			 */
			read_bdirect(infile,a,n,nqx,nqy,scratch,bit);
		} else if (b != 0xf) {
			ffpmsg("qtree_decode: bad format code");
			return(DATA_DECOMPRESSION_ERR);
		} else {
			/*
			 * bitmap was quadtree-coded, do log2n expansions
			 *
			 * read first code
			 */
			scratch[0] = input_huffman(infile);
			/*
			 * now do log2n expansions, reading codes from file as necessary
			 */
			nx = 1;
			ny = 1;
			nfx = nqx;
			nfy = nqy;
			c = 1<<log2n;
			for (k = 1; k<log2n; k++) {
				/*
				 * this somewhat cryptic code generates the sequence
				 * n[k-1] = (n[k]+1)/2 where n[log2n]=nqx or nqy
				 */
				c = c>>1;
				nx = nx<<1;
				ny = ny<<1;
				if (nfx <= c) { nx -= 1; } else { nfx -= c; }
				if (nfy <= c) { ny -= 1; } else { nfy -= c; }
				qtree_expand(infile,scratch,nx,ny,scratch);
			}
			/*
			 * now copy last set of 4-bit codes to bitplane bit of array a
			 */
			qtree_bitins(scratch,nqx,nqy,a,n,bit);
		}
	}
	free(scratch);
	return(0);
}